

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall
slang::parsing::Lexer::Lexer
          (Lexer *this,BufferID bufferId,string_view source,char *startPtr,BumpAllocator *alloc,
          Diagnostics *diagnostics,SourceManager *sourceManager,LexerOptions *options)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  
  this->alloc = alloc;
  this->diagnostics = diagnostics;
  LexerOptions::LexerOptions(&this->options,options);
  (this->bufferId).id = bufferId.id;
  this->originalBegin = source._M_str;
  this->sourceBuffer = startPtr;
  pcVar2 = source._M_str + source._M_len;
  this->sourceEnd = pcVar2;
  this->marker = (char *)0x0;
  this->errorCount = 0;
  (this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.data_ =
       (pointer)(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.firstElement;
  (this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.len = 0;
  (this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.cap = 0x20;
  (this->stringBuffer).super_SmallVectorBase<char>.data_ =
       (this->stringBuffer).super_SmallVectorBase<char>.firstElement;
  (this->stringBuffer).super_SmallVectorBase<char>.len = 0;
  (this->stringBuffer).super_SmallVectorBase<char>.cap = 0x28;
  this->library = (SourceLibrary *)0x0;
  this->sourceManager = sourceManager;
  lVar3 = (long)pcVar2 - (long)startPtr;
  if (lVar3 < 2) {
    return;
  }
  cVar1 = *startPtr;
  if (cVar1 == -2) {
    if (startPtr[1] != -1) {
      return;
    }
  }
  else {
    if (cVar1 != -1) {
      if (cVar1 != -0x11 || lVar3 == 2) {
        return;
      }
      if (startPtr[1] != -0x45) {
        return;
      }
      if (startPtr[2] != -0x41) {
        return;
      }
      pcVar2 = startPtr + 3;
      goto LAB_00340f00;
    }
    if (startPtr[1] != -2) {
      return;
    }
  }
  this->errorCount = 1;
  addDiag(this,(DiagCode)0x110002,0);
  pcVar2 = this->sourceBuffer + 2;
LAB_00340f00:
  this->sourceBuffer = pcVar2;
  return;
}

Assistant:

Lexer::Lexer(BufferID bufferId, std::string_view source, const char* startPtr, BumpAllocator& alloc,
             Diagnostics& diagnostics, SourceManager& sourceManager, LexerOptions options) :
    alloc(alloc), diagnostics(diagnostics), options(std::move(options)), bufferId(bufferId),
    originalBegin(source.data()), sourceBuffer(startPtr),
    sourceEnd(source.data() + source.length()), marker(nullptr), sourceManager(sourceManager) {

    ptrdiff_t count = sourceEnd - sourceBuffer;
    SLANG_ASSERT(count);
    SLANG_ASSERT(sourceEnd[-1] == '\0');

    // detect BOMs so we can give nice errors for invalid encoding
    if (count >= 2) {
        const unsigned char* ubuf = reinterpret_cast<const unsigned char*>(sourceBuffer);
        if ((ubuf[0] == 0xFF && ubuf[1] == 0xFE) || (ubuf[0] == 0xFE && ubuf[1] == 0xFF)) {
            errorCount++;
            addDiag(diag::UnicodeBOM, 0);
            advance(2);
        }
        else if (count >= 3) {
            // Silently skip the UTF8 BOM.
            if (ubuf[0] == 0xEF && ubuf[1] == 0xBB && ubuf[2] == 0xBF)
                advance(3);
        }
    }
}